

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_thread_result ma_device_thread__null(void *pData)

{
  ma_timer *pTimer;
  double dVar1;
  
  if (pData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x2457,"ma_thread_result ma_device_thread__null(void *)");
  }
  pTimer = (ma_timer *)((long)pData + 0x5458);
switchD_0010f699_default:
  ma_event_wait((ma_event *)((long)pData + 0x5380));
  switch(*(undefined4 *)((long)pData + 0x5450)) {
  case 0:
    goto switchD_0010f699_caseD_0;
  case 1:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    ma_timer_init(pTimer);
    while (1 < *(uint *)((long)pData + 0x5450)) {
      ma_sleep(10);
    }
    break;
  case 2:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    dVar1 = ma_timer_get_time_in_seconds(pTimer);
    *(double *)((long)pData + 0x5460) = dVar1 + *(double *)((long)pData + 0x5460);
    ma_timer_init(pTimer);
    break;
  case 3:
    LOCK();
    *(undefined4 *)((long)pData + 0x5450) = 0;
    UNLOCK();
    LOCK();
    *(undefined4 *)((long)pData + 0x5454) = 0;
    UNLOCK();
    ma_event_signal((ma_event *)((long)pData + 0x53e8));
    return (ma_thread_result)0x0;
  default:
    goto switchD_0010f699_default;
  }
  LOCK();
  *(undefined4 *)((long)pData + 0x5454) = 0;
  UNLOCK();
  ma_event_signal((ma_event *)((long)pData + 0x53e8));
  goto switchD_0010f699_default;
switchD_0010f699_caseD_0:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x2489,"ma_thread_result ma_device_thread__null(void *)");
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_thread__null(void* pData)
{
    ma_device* pDevice = (ma_device*)pData;
    MA_ASSERT(pDevice != NULL);

    for (;;) {  /* Keep the thread alive until the device is uninitialized. */
        /* Wait for an operation to be requested. */
        ma_event_wait(&pDevice->null_device.operationEvent);

        /* At this point an event should have been triggered. */

        /* Starting the device needs to put the thread into a loop. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_START__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);

            /* Reset the timer just in case. */
            ma_timer_init(&pDevice->null_device.timer);

            /* Keep looping until an operation has been requested. */
            while (pDevice->null_device.operation != MA_DEVICE_OP_NONE__NULL && pDevice->null_device.operation != MA_DEVICE_OP_START__NULL) {
                ma_sleep(10); /* Don't hog the CPU. */
            }

            /* Getting here means a suspend or kill operation has been requested. */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;
        }

        /* Suspending the device means we need to stop the timer and just continue the loop. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_SUSPEND__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);

            /* We need to add the current run time to the prior run time, then reset the timer. */
            pDevice->null_device.priorRunTime += ma_timer_get_time_in_seconds(&pDevice->null_device.timer);
            ma_timer_init(&pDevice->null_device.timer);

            /* We're done. */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;
        }

        /* Killing the device means we need to get out of this loop so that this thread can terminate. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_KILL__NULL) {
            ma_atomic_exchange_32(&pDevice->null_device.operation, MA_DEVICE_OP_NONE__NULL);
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_SUCCESS);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            break;
        }

        /* Getting a signal on a "none" operation probably means an error. Return invalid operation. */
        if (pDevice->null_device.operation == MA_DEVICE_OP_NONE__NULL) {
            MA_ASSERT(MA_FALSE);  /* <-- Trigger this in debug mode to ensure developers are aware they're doing something wrong (or there's a bug in a miniaudio). */
            ma_atomic_exchange_32(&pDevice->null_device.operationResult, MA_INVALID_OPERATION);
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            continue;   /* Continue the loop. Don't terminate. */
        }
    }

    return (ma_thread_result)0;
}